

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
          (ParseContext *this,UninterpretedOption *msg,char *ptr)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  pair<const_char_*,_int> pVar7;
  
  bVar1 = *ptr;
  uVar6 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar7 = ReadSizeFallback(ptr,(uint)bVar1);
    pcVar5 = pVar7.first;
    uVar6 = pVar7.second;
  }
  else {
    pcVar5 = ptr + 1;
  }
  if (pcVar5 != (char *)0x0) {
    pcVar4 = (this->super_EpsCopyInputStream).buffer_end_;
    uVar6 = uVar6 + ((int)pcVar5 - (int)pcVar4);
    (this->super_EpsCopyInputStream).limit_end_ = pcVar4 + (int)((int)uVar6 >> 0x1f & uVar6);
    iVar2 = (this->super_EpsCopyInputStream).limit_;
    (this->super_EpsCopyInputStream).limit_ = uVar6;
    iVar3 = this->depth_;
    this->depth_ = iVar3 + -1;
    if (((0 < iVar3) &&
        (pcVar5 = UninterpretedOption::_InternalParse(msg,pcVar5,this), pcVar5 != (char *)0x0)) &&
       (this->depth_ = this->depth_ + 1, (this->super_EpsCopyInputStream).last_tag_minus_1_ == 0)) {
      uVar6 = (iVar2 - uVar6) + (this->super_EpsCopyInputStream).limit_;
      (this->super_EpsCopyInputStream).limit_ = uVar6;
      (this->super_EpsCopyInputStream).limit_end_ =
           (this->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar6 >> 0x1f & uVar6);
      return pcVar5;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* ParseContext::ParseMessage(
    T* msg, const char* ptr) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  auto old = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  ptr = msg->_InternalParse(ptr, this);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}